

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prefix.cpp
# Opt level: O3

Prefix * duckdb::Prefix::GetTail(Prefix *__return_storage_ptr__,ART *art,Node *node)

{
  IndexPointer ptr_p;
  Prefix local_40;
  
  Prefix(__return_storage_ptr__,art,(Node)(node->super_IndexPointer).data,true,false);
  ptr_p.data = (__return_storage_ptr__->ptr->super_IndexPointer).data;
  if ((ptr_p.data & 0x7f00000000000000) == 0x100000000000000) {
    do {
      Prefix(&local_40,art,(Node)ptr_p.data,true,false);
      __return_storage_ptr__->in_memory = local_40.in_memory;
      __return_storage_ptr__->data = local_40.data;
      __return_storage_ptr__->ptr = local_40.ptr;
      ptr_p.data = (__return_storage_ptr__->ptr->super_IndexPointer).data;
    } while ((ptr_p.data & 0x7f00000000000000) == 0x100000000000000);
  }
  return __return_storage_ptr__;
}

Assistant:

Prefix Prefix::GetTail(ART &art, const Node &node) {
	Prefix prefix(art, node, true);
	while (prefix.ptr->GetType() == PREFIX) {
		prefix = Prefix(art, *prefix.ptr, true);
	}
	return prefix;
}